

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutil.c
# Opt level: O3

void cPrint_SuperNode_Matrix(char *what,SuperMatrix *A)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  float *pfVar17;
  ulong uVar18;
  
  printf("\nSuperNode matrix %s:\n",what);
  printf("Stype %d, Dtype %d, Mtype %d\n",(ulong)A->Stype,(ulong)A->Dtype,(ulong)A->Mtype);
  uVar1 = A->ncol;
  uVar13 = (ulong)uVar1;
  piVar4 = (int *)A->Store;
  lVar16 = *(long *)(piVar4 + 2);
  lVar5 = *(long *)(piVar4 + 10);
  lVar6 = *(long *)(piVar4 + 0xc);
  lVar7 = *(long *)(piVar4 + 8);
  lVar8 = *(long *)(piVar4 + 6);
  printf("nrow %d, ncol %d, nnz %lld, nsuper %d\n",(ulong)(uint)A->nrow,uVar13,(long)*piVar4,
         (ulong)(uint)piVar4[1]);
  puts("nzval:");
  iVar10 = piVar4[1];
  if (-1 < iVar10) {
    lVar12 = 0;
    do {
      iVar2 = *(int *)(lVar6 + lVar12 * 4);
      uVar14 = (ulong)iVar2;
      iVar3 = *(int *)(lVar6 + 4 + lVar12 * 4);
      if (iVar2 < iVar3) {
        uVar11 = (ulong)*(uint *)(lVar7 + 4 + uVar14 * 4);
        uVar18 = uVar14;
        do {
          iVar10 = *(int *)(lVar7 + uVar14 * 4);
          lVar15 = (long)iVar10;
          if (iVar10 < (int)uVar11) {
            pfVar17 = (float *)(lVar16 + 4 + (long)*(int *)(*(long *)(piVar4 + 4) + uVar18 * 4) * 4)
            ;
            do {
              printf("%d\t%d\t%e\t%e\n",(double)pfVar17[-1],(double)*pfVar17,
                     (ulong)*(uint *)(lVar8 + lVar15 * 4),uVar18 & 0xffffffff);
              lVar15 = lVar15 + 1;
              uVar11 = (ulong)*(int *)(lVar7 + 4 + uVar14 * 4);
              pfVar17 = pfVar17 + 2;
            } while (lVar15 < (long)uVar11);
          }
          uVar18 = uVar18 + 1;
        } while (iVar3 != (int)uVar18);
        iVar10 = piVar4[1];
      }
      bVar9 = lVar12 < iVar10;
      lVar12 = lVar12 + 1;
    } while (bVar9);
  }
  printf("\nnzval_colptr: ");
  if (-1 < (int)uVar1) {
    lVar16 = 0;
    do {
      printf("%lld  ",(long)*(int *)(*(long *)(piVar4 + 4) + lVar16 * 4));
      lVar16 = lVar16 + 1;
    } while (uVar13 + 1 != lVar16);
  }
  printf("\nrowind: ");
  if (0 < *(int *)(*(long *)(piVar4 + 8) + (long)(int)uVar1 * 4)) {
    lVar16 = 0;
    do {
      printf("%lld  ",(long)*(int *)(*(long *)(piVar4 + 6) + lVar16 * 4));
      lVar16 = lVar16 + 1;
    } while (lVar16 < *(int *)(*(long *)(piVar4 + 8) + (long)(int)uVar1 * 4));
  }
  printf("\nrowind_colptr: ");
  if ((int)uVar1 < 0) {
    printf("\ncol_to_sup: ");
  }
  else {
    lVar16 = 0;
    do {
      printf("%lld  ",(long)*(int *)(*(long *)(piVar4 + 8) + lVar16 * 4));
      lVar16 = lVar16 + 1;
    } while (uVar13 + 1 != lVar16);
    printf("\ncol_to_sup: ");
    if (uVar1 != 0) {
      uVar14 = 0;
      do {
        printf("%d  ",(ulong)*(uint *)(lVar5 + uVar14 * 4));
        uVar14 = uVar14 + 1;
      } while (uVar13 != uVar14);
    }
  }
  printf("\nsup_to_col: ");
  if (-2 < piVar4[1]) {
    lVar16 = -1;
    do {
      printf("%d  ",(ulong)*(uint *)(lVar6 + 4 + lVar16 * 4));
      lVar16 = lVar16 + 1;
    } while (lVar16 <= piVar4[1]);
  }
  putchar(10);
  fflush(_stdout);
  return;
}

Assistant:

void
cPrint_SuperNode_Matrix(char *what, SuperMatrix *A)
{
    SCformat     *Astore;
    register int_t i, j, k, c, d, n, nsup;
    float       *dp;
    int *col_to_sup, *sup_to_col;
    int_t *rowind, *rowind_colptr;
    
    printf("\nSuperNode matrix %s:\n", what);
    printf("Stype %d, Dtype %d, Mtype %d\n", A->Stype,A->Dtype,A->Mtype);
    n = A->ncol;
    Astore = (SCformat *) A->Store;
    dp = (float *) Astore->nzval;
    col_to_sup = Astore->col_to_sup;
    sup_to_col = Astore->sup_to_col;
    rowind_colptr = Astore->rowind_colptr;
    rowind = Astore->rowind;
    printf("nrow %d, ncol %d, nnz %lld, nsuper %d\n", 
	   (int)A->nrow, (int)A->ncol, (long long) Astore->nnz, (int)Astore->nsuper);
    printf("nzval:\n");
    for (k = 0; k <= Astore->nsuper; ++k) {
      c = sup_to_col[k];
      nsup = sup_to_col[k+1] - c;
      for (j = c; j < c + nsup; ++j) {
	d = Astore->nzval_colptr[j];
	for (i = rowind_colptr[c]; i < rowind_colptr[c+1]; ++i) {
	  printf("%d\t%d\t%e\t%e\n", (int)rowind[i], (int) j, dp[d], dp[d+1]);
          d += 2;	
	}
      }
    }
#if 0
    for (i = 0; i < 2*Astore->nzval_colptr[n]; ++i) printf("%f  ", dp[i]);
#endif
    printf("\nnzval_colptr: ");
    for (i = 0; i <= n; ++i) printf("%lld  ", (long long)Astore->nzval_colptr[i]);
    printf("\nrowind: ");
    for (i = 0; i < Astore->rowind_colptr[n]; ++i) 
        printf("%lld  ", (long long)Astore->rowind[i]);
    printf("\nrowind_colptr: ");
    for (i = 0; i <= n; ++i) printf("%lld  ", (long long)Astore->rowind_colptr[i]);
    printf("\ncol_to_sup: ");
    for (i = 0; i < n; ++i) printf("%d  ", col_to_sup[i]);
    printf("\nsup_to_col: ");
    for (i = 0; i <= Astore->nsuper+1; ++i) 
        printf("%d  ", sup_to_col[i]);
    printf("\n");
    fflush(stdout);
}